

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwMaximizeWindow(GLFWwindow *handle)

{
  unsigned_long *puVar1;
  Atom AVar2;
  unsigned_long uVar3;
  ulong uVar4;
  _GLFWwindow *window;
  ulong uVar5;
  uchar *puStack_118;
  int iStack_10c;
  Atom AStack_108;
  Atom AStack_100;
  unsigned_long uStack_f8;
  unsigned_long uStack_f0;
  XEvent XStack_e8;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x2f6,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x50) != 0) {
      return;
    }
    if (((_glfw.x11.NET_WM_STATE != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
       (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
      (*_glfw.x11.xlib.GetWindowAttributes)
                (_glfw.x11.display,*(Window *)(handle + 0x358),(XWindowAttributes *)&XStack_e8.xany)
      ;
      AVar2 = _glfw.x11.NET_WM_STATE;
      if (XStack_e8.xcrossing.focus == 2) {
        AStack_108 = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        AStack_100 = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        memset(&XStack_e8,0,0xc0);
        XStack_e8.type = 0x21;
        XStack_e8.xany.window = *(undefined8 *)(handle + 0x358);
        XStack_e8.xexpose.width = 0x20;
        XStack_e8.xproperty.atom = AVar2;
        XStack_e8.xkey.time = 1;
        XStack_e8.xselectionrequest.property = AStack_108;
        XStack_e8.xconfigure.above = AStack_100;
        XStack_e8.pad[10] = 1;
        XStack_e8.xconfigurerequest.value_mask = 0;
        (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,&XStack_e8);
      }
      else {
        puStack_118 = (uchar *)0x0;
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,*(Window *)(handle + 0x358),_glfw.x11.NET_WM_STATE,0,
                   0x7fffffffffffffff,0,4,(Atom *)XStack_e8.pad,&iStack_10c,&uStack_f0,&uStack_f8,
                   &puStack_118);
        XStack_e8.pad[0] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        XStack_e8.xany.serial = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        uVar5 = 2;
        if (uStack_f0 != 0) {
          uVar3 = 0;
          do {
            if (uVar5 != 0) {
              uVar4 = 0;
              do {
                if (*(long *)(puStack_118 + uVar3 * 8) == *(long *)((long)&XStack_e8 + uVar4 * 8)) {
                  puVar1 = &uStack_f0 + uVar5;
                  uVar5 = uVar5 - 1;
                  *(unsigned_long *)((long)&XStack_e8 + uVar4 * 8) = *puVar1;
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 < uVar5);
            }
            uVar3 = uVar3 + 1;
          } while (uVar3 != uStack_f0);
        }
        if (puStack_118 != (uchar *)0x0) {
          (*_glfw.x11.xlib.Free)(puStack_118);
        }
        if (uVar5 == 0) {
          return;
        }
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(handle + 0x358),_glfw.x11.NET_WM_STATE,4,0x20,2,
                   (uchar *)&XStack_e8.type,(int)uVar5);
      }
      (*_glfw.x11.xlib.Flush)(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}